

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

void secp256k1_ellswift_xswiftec_frac_var
               (secp256k1_fe *xn,secp256k1_fe *xd,secp256k1_fe *u,secp256k1_fe *t)

{
  int iVar1;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  secp256k1_fe l;
  secp256k1_fe n;
  secp256k1_fe d;
  secp256k1_fe p;
  secp256k1_fe g;
  secp256k1_fe s;
  secp256k1_fe u1;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  secp256k1_fe *in_stack_fffffffffffffe90;
  undefined1 local_140 [40];
  secp256k1_fe *in_stack_fffffffffffffee8;
  secp256k1_fe *in_stack_fffffffffffffef0;
  undefined1 local_e0 [48];
  undefined1 local_b0 [48];
  undefined1 local_80 [48];
  undefined1 local_50 [64];
  void *local_10;
  void *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  memcpy(local_50,in_RDX,0x30);
  iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)0x10a5ee);
  if (iVar1 != 0) {
    memcpy(local_50,&secp256k1_fe_one,0x30);
  }
  secp256k1_fe_sqr(in_stack_fffffffffffffe90,
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)0x10a631);
  if (iVar1 != 0) {
    memcpy(local_80,&secp256k1_fe_one,0x30);
  }
  secp256k1_fe_sqr(in_stack_fffffffffffffe90,
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  secp256k1_fe_mul(in_stack_fffffffffffffe90,
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   (secp256k1_fe *)0x10a67e);
  secp256k1_fe_add_int(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
  memcpy(local_e0,local_b0,0x30);
  secp256k1_fe_add(in_stack_fffffffffffffe90,
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)0x10a6cc);
  if (iVar1 != 0) {
    secp256k1_fe_mul_int_unchecked(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    memcpy(local_e0,local_b0,0x30);
    secp256k1_fe_add(in_stack_fffffffffffffe90,
                     (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  }
  secp256k1_fe_mul(in_stack_fffffffffffffe90,
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   (secp256k1_fe *)0x10a72e);
  secp256k1_fe_mul_int_unchecked(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
  secp256k1_fe_sqr(in_stack_fffffffffffffe90,
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  secp256k1_fe_negate_unchecked
            (in_stack_fffffffffffffe90,
             (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
  secp256k1_fe_mul(in_stack_fffffffffffffe90,
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   (secp256k1_fe *)0x10a778);
  secp256k1_fe_add(in_stack_fffffffffffffe90,
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  iVar1 = secp256k1_ge_x_frac_on_curve_var(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if (iVar1 == 0) {
    memcpy(local_10,local_e0,0x30);
    secp256k1_fe_mul(in_stack_fffffffffffffe90,
                     (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                     (secp256k1_fe *)0x10a801);
    secp256k1_fe_mul(in_stack_fffffffffffffe90,
                     (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                     (secp256k1_fe *)0x10a81a);
    secp256k1_fe_add(in_stack_fffffffffffffe90,
                     (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    secp256k1_fe_mul(in_stack_fffffffffffffe90,
                     (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                     (secp256k1_fe *)0x10a83e);
    iVar1 = secp256k1_ge_x_frac_on_curve_var(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    if (iVar1 == 0) {
      secp256k1_fe_mul(in_stack_fffffffffffffe90,
                       (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
                       ,(secp256k1_fe *)0x10a88b);
      secp256k1_fe_add(in_stack_fffffffffffffe90,
                       (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
                      );
      secp256k1_fe_negate_unchecked
                (in_stack_fffffffffffffe90,
                 (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
      iVar1 = secp256k1_ge_x_frac_on_curve_var(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/ellswift/main_impl.h"
                ,0x82,"test condition failed: secp256k1_ge_x_frac_on_curve_var(xn, &p)");
        abort();
      }
    }
    else {
      memcpy(local_8,local_140,0x30);
    }
  }
  else {
    memcpy(local_8,local_140,0x30);
    memcpy(local_10,&stack0xfffffffffffffef0,0x30);
  }
  return;
}

Assistant:

static void secp256k1_ellswift_xswiftec_frac_var(secp256k1_fe *xn, secp256k1_fe *xd, const secp256k1_fe *u, const secp256k1_fe *t) {
    /* The implemented algorithm is the following (all operations in GF(p)):
     *
     * - Let c0 = sqrt(-3) = 0xa2d2ba93507f1df233770c2a797962cc61f6d15da14ecd47d8d27ae1cd5f852.
     * - If u = 0, set u = 1.
     * - If t = 0, set t = 1.
     * - If u^3+7+t^2 = 0, set t = 2*t.
     * - Let X = (u^3+7-t^2)/(2*t).
     * - Let Y = (X+t)/(c0*u).
     * - If x3 = u+4*Y^2 is a valid x coordinate, return it.
     * - If x2 = (-X/Y-u)/2 is a valid x coordinate, return it.
     * - Return x1 = (X/Y-u)/2 (which is now guaranteed to be a valid x coordinate).
     *
     * Introducing s=t^2, g=u^3+7, and simplifying x1=-(x2+u) we get:
     *
     * - Let c0 = ...
     * - If u = 0, set u = 1.
     * - If t = 0, set t = 1.
     * - Let s = t^2
     * - Let g = u^3+7
     * - If g+s = 0, set t = 2*t, s = 4*s
     * - Let X = (g-s)/(2*t).
     * - Let Y = (X+t)/(c0*u) = (g+s)/(2*c0*t*u).
     * - If x3 = u+4*Y^2 is a valid x coordinate, return it.
     * - If x2 = (-X/Y-u)/2 is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     *
     * Now substitute Y^2 = -(g+s)^2/(12*s*u^2) and X/Y = c0*u*(g-s)/(g+s). This
     * means X and Y do not need to be evaluated explicitly anymore.
     *
     * - ...
     * - If g+s = 0, set s = 4*s.
     * - If x3 = u-(g+s)^2/(3*s*u^2) is a valid x coordinate, return it.
     * - If x2 = (-c0*u*(g-s)/(g+s)-u)/2 is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     *
     * Simplifying x2 using 2 additional constants:
     *
     * - Let c1 = (c0-1)/2 = 0x851695d49a83f8ef919bb86153cbcb16630fb68aed0a766a3ec693d68e6afa40.
     * - Let c2 = (-c0-1)/2 = 0x7ae96a2b657c07106e64479eac3434e99cf0497512f58995c1396c28719501ee.
     * - ...
     * - If x2 = u*(c1*s+c2*g)/(g+s) is a valid x coordinate, return it.
     * - ...
     *
     * Writing x3 as a fraction:
     *
     * - ...
     * - If x3 = (3*s*u^3-(g+s)^2)/(3*s*u^2) ...
     * - ...

     * Overall, we get:
     *
     * - Let c1 = 0x851695d49a83f8ef919bb86153cbcb16630fb68aed0a766a3ec693d68e6afa40.
     * - Let c2 = 0x7ae96a2b657c07106e64479eac3434e99cf0497512f58995c1396c28719501ee.
     * - If u = 0, set u = 1.
     * - If t = 0, set s = 1, else set s = t^2.
     * - Let g = u^3+7.
     * - If g+s = 0, set s = 4*s.
     * - If x3 = (3*s*u^3-(g+s)^2)/(3*s*u^2) is a valid x coordinate, return it.
     * - If x2 = u*(c1*s+c2*g)/(g+s) is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     */
    secp256k1_fe u1, s, g, p, d, n, l;
    u1 = *u;
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&u1), 0)) u1 = secp256k1_fe_one;
    secp256k1_fe_sqr(&s, t);
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(t), 0)) s = secp256k1_fe_one;
    secp256k1_fe_sqr(&l, &u1);                                   /* l = u^2 */
    secp256k1_fe_mul(&g, &l, &u1);                               /* g = u^3 */
    secp256k1_fe_add_int(&g, SECP256K1_B);                       /* g = u^3 + 7 */
    p = g;                                                       /* p = g */
    secp256k1_fe_add(&p, &s);                                    /* p = g+s */
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&p), 0)) {
        secp256k1_fe_mul_int(&s, 4);
        /* Recompute p = g+s */
        p = g;                                                   /* p = g */
        secp256k1_fe_add(&p, &s);                                /* p = g+s */
    }
    secp256k1_fe_mul(&d, &s, &l);                                /* d = s*u^2 */
    secp256k1_fe_mul_int(&d, 3);                                 /* d = 3*s*u^2 */
    secp256k1_fe_sqr(&l, &p);                                    /* l = (g+s)^2 */
    secp256k1_fe_negate(&l, &l, 1);                              /* l = -(g+s)^2 */
    secp256k1_fe_mul(&n, &d, &u1);                               /* n = 3*s*u^3 */
    secp256k1_fe_add(&n, &l);                                    /* n = 3*s*u^3-(g+s)^2 */
    if (secp256k1_ge_x_frac_on_curve_var(&n, &d)) {
        /* Return x3 = n/d = (3*s*u^3-(g+s)^2)/(3*s*u^2) */
        *xn = n;
        *xd = d;
        return;
    }
    *xd = p;
    secp256k1_fe_mul(&l, &secp256k1_ellswift_c1, &s);            /* l = c1*s */
    secp256k1_fe_mul(&n, &secp256k1_ellswift_c2, &g);            /* n = c2*g */
    secp256k1_fe_add(&n, &l);                                    /* n = c1*s+c2*g */
    secp256k1_fe_mul(&n, &n, &u1);                               /* n = u*(c1*s+c2*g) */
    /* Possible optimization: in the invocation below, p^2 = (g+s)^2 is computed,
     * which we already have computed above. This could be deduplicated. */
    if (secp256k1_ge_x_frac_on_curve_var(&n, &p)) {
        /* Return x2 = n/p = u*(c1*s+c2*g)/(g+s) */
        *xn = n;
        return;
    }
    secp256k1_fe_mul(&l, &p, &u1);                               /* l = u*(g+s) */
    secp256k1_fe_add(&n, &l);                                    /* n = u*(c1*s+c2*g)+u*(g+s) */
    secp256k1_fe_negate(xn, &n, 2);                              /* n = -u*(c1*s+c2*g)-u*(g+s) */

    VERIFY_CHECK(secp256k1_ge_x_frac_on_curve_var(xn, &p));
    /* Return x3 = n/p = -(u*(c1*s+c2*g)/(g+s)+u) */
}